

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaParseLocalAttributes
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr *child,
              xmlSchemaItemListPtr *list,int parentType,int *hasRefs)

{
  xmlSchemaRedefPtr_conflict pxVar1;
  undefined8 refNs;
  int iVar2;
  xmlNodePtr pxVar3;
  xmlAttrPtr pxVar4;
  xmlChar **str1;
  xmlSchemaItemListPtr list_00;
  xmlSchemaAttributeUsePtr_conflict item;
  xmlSchemaAttributePtr pxVar5;
  int *piVar6;
  xmlSchemaAnnotPtr pxVar7;
  xmlSchemaAttributePtr_conflict pxVar8;
  xmlSchemaTypePtr pxVar9;
  uint uVar10;
  _xmlSchemaType *p_Var11;
  char *type;
  xmlNodePtr pxVar12;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlDictPtr pxVar13;
  xmlSchemaBasicItemPtr pxVar14;
  xmlParserErrors xVar15;
  long lVar16;
  undefined4 in_register_00000084;
  char *type_00;
  char *uri;
  xmlSchemaPtr schema_00;
  xmlSchemaAttributePtr node;
  bool bVar17;
  xmlChar *tmpNs;
  xmlChar *tmpName;
  xmlChar *name;
  char *in_stack_ffffffffffffff38;
  xmlChar *in_stack_ffffffffffffff40;
  xmlChar *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int iVar18;
  int local_9c;
  undefined1 local_98 [24];
  xmlChar *local_80;
  int local_74;
  xmlSchemaAttributePtr local_70;
  xmlNodePtr local_68;
  xmlSchemaTypePtr local_60;
  int local_54;
  xmlNodePtr local_50;
  int local_44;
  _xmlSchemaType *local_40;
  int *local_38;
  
  type_00 = (char *)CONCAT44(in_register_00000084,parentType);
  pxVar5 = (xmlSchemaAttributePtr)*child;
  local_60 = (xmlSchemaTypePtr)schema;
  local_50 = (xmlNodePtr)list;
  local_44 = parentType;
  uri = (char *)hasRefs;
  local_38 = hasRefs;
  do {
    if (pxVar5 == (xmlSchemaAttributePtr)0x0) {
      return 0;
    }
    if (pxVar5->base == (xmlSchemaTypePtr)0x0) {
LAB_0019826c:
      if (pxVar5->base == (xmlSchemaTypePtr)0x0) {
        return 0;
      }
      iVar2 = xmlStrEqual(pxVar5->name,(xmlChar *)"attributeGroup");
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = xmlStrEqual((*child)->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      iVar2 = xmlStrEqual(pxVar5->name,"attribute");
      pxVar5 = (xmlSchemaAttributePtr)*child;
      if (iVar2 == 0) {
LAB_00198263:
        if (pxVar5 == (xmlSchemaAttributePtr)0x0) {
          return 0;
        }
        goto LAB_0019826c;
      }
      iVar2 = xmlStrEqual(pxVar5->base->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (iVar2 == 0) {
        pxVar5 = (xmlSchemaAttributePtr)*child;
        goto LAB_00198263;
      }
    }
    schema_00 = (xmlSchemaPtr)*child;
    if (schema_00 == (xmlSchemaPtr)0x0) goto LAB_00198e88;
    if ((xmlNs *)schema_00->attrgrpDecl == (xmlNs *)0x0) {
LAB_0019871a:
      local_98._16_8_ = (_xmlSchemaType *)0x0;
      local_98._0_8_ = (xmlSchemaAttributePtr)0x0;
      pxVar3 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)schema_00,"ref");
      if (pxVar3 == (xmlNodePtr)0x0) {
        xVar15 = (xmlParserErrors)schema_00;
        pxVar14 = (xmlSchemaBasicItemPtr)0x1de8e1;
LAB_001987e1:
        xmlSchemaPMissingAttrErr(ctxt,xVar15,pxVar14,(xmlNodePtr)pxVar5,type_00,uri);
      }
      else {
        pxVar4 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,pxVar3);
        type_00 = local_98 + 0x10;
        uri = local_98;
        xmlSchemaPValAttrNodeQNameValue
                  (ctxt,(xmlSchemaPtr)local_60,(xmlSchemaBasicItemPtr)pxVar3,pxVar4,
                   (xmlChar *)type_00,(xmlChar **)uri,(xmlChar **)in_stack_ffffffffffffff38);
        refNs = local_98._16_8_;
        p_Var11 = (_xmlSchemaType *)local_98._16_8_;
        iVar2 = xmlSchemaCheckReference
                          (ctxt,schema_00,pxVar3,(xmlAttrPtr)local_98._16_8_,(xmlChar *)type_00);
        if (iVar2 == 0) {
          pxVar14 = extraout_RDX_01;
          for (pxVar13 = (xmlDictPtr)schema_00->notaDecl; pxVar13 != (xmlDictPtr)0x0;
              pxVar13 = (xmlDictPtr)((xmlHashTablePtr)&pxVar13->seed)->table) {
            if (*(long *)&((xmlHashTablePtr)(pxVar13 + 1))->size == 0) {
              iVar2 = xmlStrEqual((xmlChar *)pxVar13->size,"ref");
              pxVar14 = extraout_RDX_04;
              if ((iVar2 == 0) &&
                 (iVar2 = xmlStrEqual((xmlChar *)pxVar13->size,"id"), pxVar14 = extraout_RDX_05,
                 iVar2 == 0)) goto LAB_001987a1;
            }
            else {
              iVar2 = xmlStrEqual(*(xmlChar **)
                                   (*(long *)&((xmlHashTablePtr)(pxVar13 + 1))->size + 0x10),
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar14 = extraout_RDX_02;
              if (iVar2 != 0) {
LAB_001987a1:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)pxVar13,pxVar14,(xmlAttrPtr)p_Var11);
                pxVar14 = extraout_RDX_03;
              }
            }
          }
          xmlSchemaPValAttrID(ctxt,(xmlNodePtr)schema_00,(xmlChar *)pxVar14);
          pxVar3 = (xmlNodePtr)schema_00->id;
          if (pxVar3 != (xmlNodePtr)0x0) {
            if (((pxVar3->ns != (xmlNs *)0x0) &&
                (iVar2 = xmlStrEqual(pxVar3->name,(xmlChar *)"annotation"), iVar2 != 0)) &&
               (iVar2 = xmlStrEqual(pxVar3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
               iVar2 != 0)) {
              xmlSchemaParseAnnotation(ctxt,pxVar3,0);
              pxVar3 = pxVar3->next;
              if (pxVar3 == (_xmlNode *)0x0) goto LAB_00198866;
            }
            type_00 = (char *)0x0;
            uri = "(annotation?)";
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)schema_00,pxVar3
                       ,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff38);
          }
LAB_00198866:
          if (((ctxt->isRedefine == 0) ||
              (pxVar1 = ctxt->redef, pxVar1 == (xmlSchemaRedefPtr_conflict)0x0)) ||
             ((pxVar1->item->type != XML_SCHEMA_TYPE_ATTRIBUTEGROUP ||
              (((xmlSchemaAttributePtr)local_98._0_8_ != (xmlSchemaAttributePtr)pxVar1->refName ||
               ((_xmlSchemaType *)refNs != (_xmlSchemaType *)pxVar1->refTargetNs)))))) {
            item = (xmlSchemaAttributeUsePtr_conflict)
                   xmlSchemaNewQNameRef
                             (ctxt,XML_SCHEMA_TYPE_ATTRIBUTEGROUP,(xmlChar *)local_98._0_8_,
                              (xmlChar *)refNs);
            if (item != (xmlSchemaAttributeUsePtr_conflict)0x0) {
              item->node = (xmlNodePtr)schema_00;
              iVar2 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
              if (iVar2 < 0) {
                ctxt->nberrors = ctxt->nberrors + 1;
                ctxt->err = 2;
                type_00 = (char *)0x0;
                xmlRaiseMemoryError(ctxt->serror,ctxt->error,ctxt->errCtxt,0x10,(xmlError *)0x0);
              }
LAB_001988fd:
              if (local_38 != (int *)0x0) {
                *local_38 = 1;
              }
              goto LAB_00198910;
            }
          }
          else if (ctxt->redefCounter == 0) {
            ctxt->redefCounter = 1;
            item = (xmlSchemaAttributeUsePtr_conflict)
                   xmlSchemaNewQNameRef
                             (ctxt,XML_SCHEMA_TYPE_ATTRIBUTEGROUP,(xmlChar *)local_98._0_8_,
                              (xmlChar *)refNs);
            if (item != (xmlSchemaAttributeUsePtr_conflict)0x0) {
              item->node = (xmlNodePtr)schema_00;
              ctxt->redef->reference = (xmlSchemaBasicItemPtr)item;
              goto LAB_001988fd;
            }
          }
          else {
            local_98._8_8_ = (_xmlSchemaType *)0x0;
            uri = (char *)xmlSchemaFormatQName
                                    ((xmlChar **)(local_98 + 8),(xmlChar *)refNs,
                                     (xmlChar *)local_98._0_8_);
            in_stack_ffffffffffffff48 = (xmlChar *)0x0;
            in_stack_ffffffffffffff38 = (char *)0x0;
            in_stack_ffffffffffffff40 = (xmlChar *)0x0;
            type_00 = 
            "The redefining attribute group definition \'%s\' must not contain more than one reference to the redefined definition"
            ;
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_SRC_REDEFINE,
                                (xmlNodePtr)schema_00,(xmlSchemaBasicItemPtr)0x0,
                                "The redefining attribute group definition \'%s\' must not contain more than one reference to the redefined definition"
                                ,(xmlChar *)uri,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            p_Var11 = (_xmlSchemaType *)local_98._8_8_;
LAB_00198be8:
            if (p_Var11 != (_xmlSchemaType *)0x0) {
              (*xmlFree)(p_Var11);
            }
          }
        }
      }
    }
    else {
      iVar2 = xmlStrEqual(schema_00->version,"attribute");
      schema_00 = (xmlSchemaPtr)*child;
      if (iVar2 == 0) {
LAB_001986f8:
        local_98._16_8_ = (_xmlSchemaType *)0x0;
        local_98._0_8_ = (xmlSchemaAttributePtr)0x0;
        if (schema_00 != (xmlSchemaPtr)0x0) goto LAB_0019871a;
      }
      else {
        iVar2 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                            (xmlChar *)"http://www.w3.org/2001/XMLSchema");
        schema_00 = (xmlSchemaPtr)*child;
        if (iVar2 == 0) goto LAB_001986f8;
        local_68 = (xmlNodePtr)local_50->_private;
        local_98._16_8_ = (_xmlSchemaType *)0x0;
        local_98._0_8_ = (xmlSchemaAttributePtr)0x0;
        local_98._8_8_ = (_xmlSchemaType *)0x0;
        if (schema_00 == (xmlSchemaPtr)0x0) goto LAB_00198e88;
        pxVar3 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)schema_00,"ref");
        if (pxVar3 != (xmlNodePtr)0x0) {
          pxVar4 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,pxVar3);
          type_00 = local_98;
          uri = local_98 + 8;
          iVar2 = xmlSchemaPValAttrNodeQNameValue
                            (ctxt,(xmlSchemaPtr)local_60,(xmlSchemaBasicItemPtr)pxVar3,pxVar4,
                             (xmlChar *)type_00,(xmlChar **)uri,
                             (xmlChar **)in_stack_ffffffffffffff38);
          if ((iVar2 != 0) ||
             (pxVar5 = (xmlSchemaAttributePtr)local_98._0_8_,
             iVar2 = xmlSchemaCheckReference
                               (ctxt,schema_00,pxVar3,(xmlAttrPtr)local_98._0_8_,(xmlChar *)type_00)
             , iVar2 != 0)) goto LAB_00198e88;
        }
        node = (xmlSchemaAttributePtr)schema_00->notaDecl;
        if (node == (xmlSchemaAttributePtr)0x0) {
          iVar18 = 2;
          bVar17 = true;
          local_70 = (xmlSchemaAttributePtr)0x0;
          local_9c = 0;
          local_80 = (xmlChar *)0x0;
          iVar2 = ctxt->nberrors;
        }
        else {
          iVar18 = 2;
          local_70 = (xmlSchemaAttributePtr)0x0;
          local_9c = 0;
          local_74 = 0;
          local_80 = (xmlChar *)0x0;
          local_54 = ctxt->nberrors;
          do {
            if (node->base == (xmlSchemaTypePtr)0x0) {
              if (pxVar3 == (xmlNodePtr)0x0) {
                iVar2 = xmlStrEqual(node->name,"name");
                if (iVar2 == 0) {
                  iVar2 = xmlStrEqual(node->name,"id");
                  if (iVar2 != 0) goto LAB_00198424;
                  iVar2 = xmlStrEqual(node->name,"type");
                  if (iVar2 == 0) {
                    iVar2 = xmlStrEqual(node->name,"form");
                    if (iVar2 == 0) goto LAB_001984ae;
                    str1 = (xmlChar **)xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)node);
                    iVar2 = xmlStrEqual((xmlChar *)str1,"qualified");
                    if (iVar2 == 0) {
                      iVar2 = xmlStrEqual((xmlChar *)str1,(xmlChar *)"unqualified");
                      local_74 = 1;
                      if (iVar2 == 0) {
                        xVar15 = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
                        type_00 = "(qualified | unqualified)";
                        goto LAB_00198676;
                      }
                    }
                    else {
                      local_70 = (xmlSchemaAttributePtr)ctxt->targetNamespace;
                      local_74 = 1;
                    }
                  }
                  else {
                    pxVar5 = (xmlSchemaAttributePtr)xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)node);
                    type_00 = local_98;
                    uri = local_98 + 8;
                    xmlSchemaPValAttrNodeQNameValue
                              (ctxt,(xmlSchemaPtr)local_60,(xmlSchemaBasicItemPtr)node,
                               (xmlAttrPtr)pxVar5,(xmlChar *)type_00,(xmlChar **)uri,
                               (xmlChar **)in_stack_ffffffffffffff38);
                  }
                }
              }
              else {
                iVar2 = xmlStrEqual(node->name,"id");
                if (iVar2 == 0) {
                  iVar2 = xmlStrEqual(node->name,"ref");
                  if (iVar2 == 0) {
LAB_001984ae:
                    iVar2 = xmlStrEqual(node->name,"use");
                    if (iVar2 == 0) {
                      iVar2 = xmlStrEqual(node->name,"default");
                      if (iVar2 == 0) {
                        iVar2 = xmlStrEqual(node->name,(xmlChar *)"fixed");
                        pxVar14 = extraout_RDX_00;
                        if (iVar2 == 0) goto LAB_001983fb;
                        if (local_80 != (xmlChar *)0x0) goto LAB_001985c7;
                        local_80 = xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)node);
                        local_9c = 2;
                      }
                      else if (local_80 == (xmlChar *)0x0) {
                        local_80 = xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)node);
                        local_9c = 1;
                      }
                      else {
LAB_001985c7:
                        type_00 = "default";
                        uri = "fixed";
                        pxVar5 = node;
                        xmlSchemaPMutualExclAttrErr
                                  (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_1,(xmlSchemaBasicItemPtr)0x0,
                                   (xmlAttrPtr)node,"default","fixed");
                      }
                    }
                    else {
                      str1 = (xmlChar **)xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)node);
                      iVar2 = xmlStrEqual((xmlChar *)str1,(xmlChar *)"optional");
                      if (iVar2 == 0) {
                        iVar2 = xmlStrEqual((xmlChar *)str1,(xmlChar *)"prohibited");
                        if (iVar2 == 0) {
                          iVar2 = xmlStrEqual((xmlChar *)str1,"required");
                          if (iVar2 == 0) {
                            xVar15 = XML_SCHEMAP_INVALID_ATTR_USE;
                            type_00 = "(optional | prohibited | required)";
LAB_00198676:
                            in_stack_ffffffffffffff40 = (xmlChar *)0x0;
                            in_stack_ffffffffffffff38 = (char *)0x0;
                            pxVar5 = (xmlSchemaAttributePtr)0x0;
                            xmlSchemaPSimpleTypeErr
                                      (ctxt,xVar15,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)0x0,
                                       (xmlSchemaTypePtr)type_00,(char *)str1,(xmlChar *)0x0,
                                       (char *)0x0,in_stack_ffffffffffffff48,
                                       (xmlChar *)CONCAT44(iVar18,in_stack_ffffffffffffff50));
                            uri = (char *)str1;
                          }
                          else {
                            iVar18 = 1;
                          }
                        }
                        else {
                          iVar18 = 0;
                        }
                      }
                      else {
                        iVar18 = 2;
                      }
                    }
                  }
                }
                else {
LAB_00198424:
                  xmlSchemaPValAttrNodeID(ctxt,(xmlAttrPtr)node);
                }
              }
            }
            else {
              iVar2 = xmlStrEqual(node->base->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar14 = extraout_RDX;
              if (iVar2 != 0) {
LAB_001983fb:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)node,pxVar14,(xmlAttrPtr)pxVar5);
              }
            }
            node = (xmlSchemaAttributePtr)node->typeName;
          } while (node != (xmlSchemaAttributePtr)0x0);
          bVar17 = local_74 == 0;
          pxVar5 = (xmlSchemaAttributePtr)
                   CONCAT71((int7)((ulong)pxVar5 >> 8),iVar18 != 2 && local_9c == 1);
          iVar2 = local_54;
          if (iVar18 != 2 && local_9c == 1) {
            in_stack_ffffffffffffff38 =
                 "The value of the attribute \'use\' must be \'optional\' if the attribute \'default\' is present"
            ;
            in_stack_ffffffffffffff40 = (xmlChar *)0x0;
            pxVar5 = (xmlSchemaAttributePtr)0x0;
            type_00 = "(optional | prohibited | required)";
            uri = (char *)0x0;
            xmlSchemaPSimpleTypeErr
                      (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_2,(xmlSchemaBasicItemPtr)schema_00,
                       (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(optional | prohibited | required)",
                       (char *)0x0,
                       (xmlChar *)
                       "The value of the attribute \'use\' must be \'optional\' if the attribute \'default\' is present"
                       ,(char *)0x0,in_stack_ffffffffffffff48,
                       (xmlChar *)CONCAT44(iVar18,in_stack_ffffffffffffff50));
            local_9c = 1;
            iVar2 = local_54;
          }
        }
        if (iVar2 != ctxt->nberrors) goto LAB_00198e88;
        if (pxVar3 == (xmlNodePtr)0x0) {
          if ((bVar17) && (((ulong)local_60->annot & 2) != 0)) {
            local_70 = (xmlSchemaAttributePtr)ctxt->targetNamespace;
          }
          iVar2 = xmlStrEqual((xmlChar *)local_70,
                              (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
          if (iVar2 != 0) {
            in_stack_ffffffffffffff38 = (char *)0x0;
            in_stack_ffffffffffffff40 = (xmlChar *)0x0;
            in_stack_ffffffffffffff48 = (xmlChar *)0x0;
            pxVar5 = (xmlSchemaAttributePtr)0x0;
            type_00 = "The target namespace must not match \'%s\'";
            uri = "http://www.w3.org/2001/XMLSchema-instance";
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_NO_XSI,
                                (xmlNodePtr)schema_00,(xmlSchemaBasicItemPtr)0x0,
                                "The target namespace must not match \'%s\'",
                                (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance",
                                (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          }
          pxVar14 = (xmlSchemaBasicItemPtr)0x1c9054;
          pxVar4 = xmlSchemaGetPropNode((xmlNodePtr)schema_00,"name");
          if (pxVar4 != (xmlAttrPtr)0x0) {
            pxVar9 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
            iVar2 = xmlSchemaPValAttrNode
                              (ctxt,(xmlSchemaBasicItemPtr)pxVar4,(xmlAttrPtr)pxVar9,
                               (xmlSchemaTypePtr)(local_98 + 0x10),(xmlChar **)type_00);
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual((xmlChar *)local_98._16_8_,"xmlns");
              if (iVar2 == 0) {
                if (iVar18 == 0) goto LAB_00198dc1;
                item = xmlSchemaAddAttributeUse(ctxt,(xmlNodePtr)schema_00);
                if (item != (xmlSchemaAttributeUsePtr_conflict)0x0) {
                  item->occurs = iVar18;
                  type_00 = (char *)0x0;
                  pxVar8 = xmlSchemaAddAttribute
                                     (ctxt,(xmlSchemaPtr)local_98._16_8_,(xmlChar *)local_70,
                                      (xmlChar *)schema_00,(xmlNodePtr)0x0,(int)uri);
                  if (pxVar8 != (xmlSchemaAttributePtr_conflict)0x0) {
                    if ((_xmlSchemaType *)local_98._8_8_ != (_xmlSchemaType *)0x0) {
                      pxVar8->typeName = (xmlChar *)local_98._8_8_;
                      pxVar8->typeNs = (xmlChar *)local_98._0_8_;
                    }
                    item->attrDecl = pxVar8;
                    if ((local_80 != (xmlChar *)0x0) && (pxVar8->defValue = local_80, local_9c == 2)
                       ) {
                      piVar6 = &pxVar8->flags;
                      uVar10 = 0x200;
                      goto LAB_00198a23;
                    }
                    goto LAB_00198a25;
                  }
                }
              }
              else {
                pxVar9 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                in_stack_ffffffffffffff38 = "The value of the attribute must not match \'xmlns\'";
                in_stack_ffffffffffffff40 = (xmlChar *)0x0;
                type_00 = (char *)0x0;
                uri = (char *)0x0;
                xmlSchemaPSimpleTypeErr
                          (ctxt,XML_SCHEMAP_NO_XMLNS,(xmlSchemaBasicItemPtr)pxVar4,
                           (xmlNodePtr)pxVar9,(xmlSchemaTypePtr)0x0,(char *)0x0,
                           (xmlChar *)"The value of the attribute must not match \'xmlns\'",
                           (char *)0x0,in_stack_ffffffffffffff48,
                           (xmlChar *)CONCAT44(iVar18,in_stack_ffffffffffffff50));
              }
            }
            goto LAB_00198e88;
          }
          xVar15 = (xmlParserErrors)schema_00;
          goto LAB_001987e1;
        }
        if (iVar18 == 0) {
LAB_00198dc1:
          pxVar12 = (xmlNodePtr)schema_00->id;
          if (pxVar12 != (xmlNodePtr)0x0) {
            if (((pxVar12->ns != (xmlNs *)0x0) &&
                (iVar2 = xmlStrEqual(pxVar12->name,(xmlChar *)"annotation"), iVar2 != 0)) &&
               (iVar2 = xmlStrEqual(pxVar12->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar2 != 0)) {
              xmlSchemaParseAnnotation(ctxt,pxVar12,0);
              pxVar12 = pxVar12->next;
              if (pxVar12 == (_xmlNode *)0x0) goto LAB_00198e36;
            }
            type_00 = (char *)0x0;
            uri = "(annotation?)";
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)schema_00,
                       pxVar12,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff38);
          }
LAB_00198e36:
          if (local_44 == 0xd) {
            type = "Skipping attribute use prohibition, since it is pointless when extending a type"
            ;
          }
          else {
            if (local_44 != 0x10) {
              if (pxVar3 == (xmlNodePtr)0x0) {
                local_98._8_8_ = local_98._16_8_;
                local_98._0_8_ = local_70;
              }
              if ((local_68 != (xmlNodePtr)0x0) && (0 < (long)(int)local_68->type)) {
                lVar16 = 0;
                do {
                  type_00 = *(char **)((long)local_68->_private + lVar16 * 8);
                  if (((((xmlSchemaTypePtr)type_00)->type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) &&
                      ((_xmlSchemaType *)local_98._8_8_ ==
                       (_xmlSchemaType *)((xmlSchemaTypePtr)type_00)->name)) &&
                     ((xmlSchemaAttributePtr)local_98._0_8_ ==
                      (xmlSchemaAttributePtr)((xmlSchemaTypePtr)type_00)->id)) {
                    local_40 = (_xmlSchemaType *)0x0;
                    type_00 = (char *)xmlSchemaFormatQName
                                                ((xmlChar **)&local_40,(xmlChar *)local_98._0_8_,
                                                 (xmlChar *)local_98._8_8_);
                    in_stack_ffffffffffffff38 = (char *)0x0;
                    uri = (char *)0x0;
                    xmlSchemaCustomWarning
                              ((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
                               (xmlNodePtr)schema_00,
                               (xmlSchemaTypePtr)
                               "Skipping duplicate attribute use prohibition \'%s\'",type_00,
                               (xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffff40);
                    p_Var11 = local_40;
                    goto LAB_00198be8;
                  }
                  lVar16 = lVar16 + 1;
                } while ((int)local_68->type != lVar16);
              }
              item = (xmlSchemaAttributeUsePtr_conflict)xmlSchemaAddAttributeUseProhib(ctxt);
              if (item != (xmlSchemaAttributeUsePtr_conflict)0x0) {
                item->annot = (xmlSchemaAnnotPtr)schema_00;
                item->next = (xmlSchemaAttributeUsePtr)local_98._8_8_;
                item->attrDecl = (xmlSchemaAttributePtr)local_98._0_8_;
                if ((pxVar3 != (xmlNodePtr)0x0) &&
                   (iVar2 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item), iVar2 < 0)) {
                  xmlSchemaPErrMemory(ctxt);
                }
                goto LAB_00198910;
              }
              goto LAB_00198e88;
            }
            type = 
            "Skipping attribute use prohibition, since it is pointless inside an <attributeGroup>";
          }
          in_stack_ffffffffffffff38 = (char *)0x0;
          type_00 = (char *)0x0;
          uri = (char *)0x0;
          xmlSchemaCustomWarning
                    ((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
                     (xmlNodePtr)schema_00,(xmlSchemaTypePtr)type,(char *)0x0,(xmlChar *)0x0,
                     (xmlChar *)0x0,in_stack_ffffffffffffff40);
          goto LAB_00198e88;
        }
        item = xmlSchemaAddAttributeUse(ctxt,(xmlNodePtr)schema_00);
        if (item == (xmlSchemaAttributeUsePtr_conflict)0x0) goto LAB_00198e88;
        iVar2 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
        if (iVar2 < 0) {
          xmlSchemaPErrMemory(ctxt);
        }
        item->occurs = iVar18;
        pxVar5 = (xmlSchemaAttributePtr)
                 xmlSchemaNewQNameRef
                           (ctxt,XML_SCHEMA_TYPE_ATTRIBUTE,(xmlChar *)local_98._8_8_,
                            (xmlChar *)local_98._0_8_);
        if (pxVar5 == (xmlSchemaAttributePtr)0x0) goto LAB_00198e88;
        item->attrDecl = pxVar5;
        if (local_80 != (xmlChar *)0x0) {
          item->defValue = local_80;
        }
        if (local_9c == 2) {
          piVar6 = &item->flags;
          uVar10 = 1;
LAB_00198a23:
          *piVar6 = *piVar6 | uVar10;
        }
LAB_00198a25:
        pxVar12 = (xmlNodePtr)schema_00->id;
        if (pxVar12 != (xmlNodePtr)0x0) {
          if (((pxVar12->ns != (xmlNs *)0x0) &&
              (iVar2 = xmlStrEqual(pxVar12->name,(xmlChar *)"annotation"), iVar2 != 0)) &&
             (iVar2 = xmlStrEqual(pxVar12->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar2 != 0)) {
            pxVar7 = xmlSchemaParseAnnotation(ctxt,pxVar12,1);
            item->annot = pxVar7;
            pxVar12 = pxVar12->next;
          }
          if (pxVar3 == (xmlNodePtr)0x0) {
            if (pxVar12 != (xmlNodePtr)0x0) {
              if (((pxVar12->ns != (xmlNs *)0x0) &&
                  (iVar2 = xmlStrEqual(pxVar12->name,"simpleType"), iVar2 != 0)) &&
                 (local_68 = pxVar12,
                 iVar2 = xmlStrEqual(pxVar12->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"
                                    ), pxVar3 = local_68, pxVar12 = local_68, iVar2 != 0)) {
                if (item->attrDecl->typeName == (xmlChar *)0x0) {
                  pxVar9 = xmlSchemaParseSimpleType(ctxt,(xmlSchemaPtr)local_60,local_68,0);
                  item->attrDecl->subtypes = pxVar9;
                }
                else {
                  type_00 = 
                  "The attribute \'type\' and the <simpleType> child are mutually exclusive";
                  uri = (char *)0x0;
                  xmlSchemaPContentErr
                            (ctxt,XML_SCHEMAP_SRC_ATTRIBUTE_4,(xmlSchemaBasicItemPtr)schema_00,
                             local_68,(xmlNodePtr)
                                      "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                             ,(char *)0x0,in_stack_ffffffffffffff38);
                }
                pxVar12 = pxVar3->next;
                if (pxVar3->next == (xmlNodePtr)0x0) goto LAB_00198910;
              }
              xVar15 = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
              uri = "(annotation?, simpleType?)";
              goto LAB_0019900d;
            }
          }
          else if (pxVar12 != (xmlNodePtr)0x0) {
            if (((pxVar12->ns == (xmlNs *)0x0) ||
                (iVar2 = xmlStrEqual(pxVar12->name,"simpleType"), iVar2 == 0)) ||
               (iVar2 = xmlStrEqual(pxVar12->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar2 == 0)) {
              xVar15 = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
            }
            else {
              xVar15 = XML_SCHEMAP_SRC_ATTRIBUTE_3_2;
            }
            uri = "(annotation?)";
LAB_0019900d:
            type_00 = (char *)0x0;
            xmlSchemaPContentErr
                      (ctxt,xVar15,(xmlSchemaBasicItemPtr)schema_00,pxVar12,(xmlNodePtr)0x0,uri,
                       in_stack_ffffffffffffff38);
          }
        }
LAB_00198910:
        list_00 = (xmlSchemaItemListPtr)local_50->_private;
        if (list_00 == (xmlSchemaItemListPtr)0x0) {
          list_00 = xmlSchemaItemListCreate();
          local_50->_private = list_00;
          if (list_00 == (xmlSchemaItemListPtr)0x0) {
            return -1;
          }
        }
        iVar2 = xmlSchemaItemListAddSize(list_00,2,item);
        if (iVar2 == -1) {
          return -1;
        }
      }
    }
LAB_00198e88:
    pxVar5 = (xmlSchemaAttributePtr)(*child)->next;
    *child = (xmlNodePtr)pxVar5;
  } while( true );
}

Assistant:

static int
xmlSchemaParseLocalAttributes(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                        xmlNodePtr *child, xmlSchemaItemListPtr *list,
			int parentType, int *hasRefs)
{
    void *item;

    while ((IS_SCHEMA((*child), "attribute")) ||
           (IS_SCHEMA((*child), "attributeGroup"))) {
        if (IS_SCHEMA((*child), "attribute")) {
	    item = xmlSchemaParseLocalAttribute(ctxt, schema, *child,
		*list, parentType);
        } else {
            item = xmlSchemaParseAttributeGroupRef(ctxt, schema, *child);
	    if ((item != NULL) && (hasRefs != NULL))
		*hasRefs = 1;
        }
	if (item != NULL) {
	    if (*list == NULL) {
		/* TODO: Customize grow factor. */
		*list = xmlSchemaItemListCreate();
		if (*list == NULL)
		    return(-1);
	    }
	    if (xmlSchemaItemListAddSize(*list, 2, item) == -1)
		return(-1);
	}
        *child = (*child)->next;
    }
    return (0);
}